

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createOpSourceContinuedTests(TestContext *testCtx)

{
  undefined1 *inputColors;
  string *psVar1;
  NameCodePair *pNVar2;
  long lVar3;
  TestCaseGroup *pTVar4;
  mapped_type *this;
  size_t num4ByteChars;
  NameCodePair *local_340;
  RGBA *local_278;
  string local_270;
  allocator<char> local_249;
  key_type local_248;
  ulong local_228;
  size_t testNdx;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator<char> local_1b4;
  allocator<char> local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  string *local_1b0;
  undefined1 local_1a8 [8];
  NameCodePair tests [4];
  undefined1 local_98 [8];
  string opsource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  undefined1 local_38 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opSourceTests;
  RGBA defaultColors [4];
  TestContext *testCtx_local;
  
  local_278 = (RGBA *)&opSourceTests.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data.field_0x8;
  defaultColors._8_8_ = testCtx;
  do {
    tcu::RGBA::RGBA(local_278);
    local_278 = local_278 + 1;
  } while (local_278 != defaultColors + 2);
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)defaultColors._8_8_,"opsourcecontinued",
             "OpSourceContinued instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             ((long)&fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38,pTVar4
            );
  passthruFragments_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,
             "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile \"void main(){}\"\n",
             (allocator<char> *)&stack0xffffffffffffff67);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  testNdx._6_1_ = 1;
  local_1b0 = (string *)local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a8,"empty",&local_1b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[0].name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "OpSourceContinued \"\"");
  psVar1 = (string *)(tests[0].code.field_2._M_local_buf + 8);
  local_1b0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"short",&local_1b2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[1].name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "OpSourceContinued \"abcde\"");
  psVar1 = (string *)(tests[1].code.field_2._M_local_buf + 8);
  local_1b0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"multiple",&local_1b3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[2].name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "OpSourceContinued \"abcde\"\nOpSourceContinued \"fghij\"");
  psVar1 = (string *)(tests[2].code.field_2._M_local_buf + 8);
  local_1b0 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"long",&local_1b4);
  testNdx._7_1_ = 1;
  std::operator+(&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "OpSourceContinued \"");
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_218,(_anonymous_namespace_ *)0xfffd,num4ByteChars);
  std::operator+(&local_1d8,&local_1f8,&local_218);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tests[3].name.field_2 + 8),&local_1d8,"ccc\"");
  testNdx._7_1_ = 0;
  testNdx._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1b4);
  std::allocator<char>::~allocator(&local_1b3);
  std::allocator<char>::~allocator(&local_1b2);
  std::allocator<char>::~allocator(&local_1b1);
  getDefaultColors((RGBA (*) [4])
                   &opSourceTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0x8);
  for (local_228 = 0; local_228 < 4; local_228 = local_228 + 1) {
    pNVar2 = tests + local_228;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"debug",&local_249);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&opsource.field_2 + 8),&local_248);
    std::__cxx11::string::operator=
              ((string *)this,(string *)((pNVar2->name).field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
    lVar3 = local_228 - 1;
    pTVar4 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38
                );
    std::__cxx11::string::string((string *)&local_270);
    inputColors = &opSourceTests.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data.field_0x8;
    createTestsForAllStages
              ((string *)((long)&tests[lVar3].code.field_2 + 8),(RGBA (*) [4])inputColors,
               (RGBA (*) [4])inputColors,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&opsource.field_2 + 8),pTVar4,QP_TEST_RESULT_FAIL,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38)
  ;
  local_340 = (NameCodePair *)((long)&tests[3].code.field_2 + 8);
  do {
    local_340 = local_340 + -1;
    createOpSourceContinuedTests::NameCodePair::~NameCodePair(local_340);
  } while (local_340 != (NameCodePair *)local_1a8);
  std::__cxx11::string::~string((string *)local_98);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)((long)&opsource.field_2 + 8));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_38);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpSourceContinuedTests (tcu::TestContext& testCtx)
{
	struct NameCodePair { string name, code; };
	RGBA								defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup>		opSourceTests		(new tcu::TestCaseGroup(testCtx, "opsourcecontinued", "OpSourceContinued instruction"));
	map<string, string>					fragments			= passthruFragments();
	const std::string					opsource			= "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile \"void main(){}\"\n";
	const NameCodePair					tests[]				=
	{
		{"empty", opsource + "OpSourceContinued \"\""},
		{"short", opsource + "OpSourceContinued \"abcde\""},
		{"multiple", opsource + "OpSourceContinued \"abcde\"\nOpSourceContinued \"fghij\""},
		// Longest possible source string: SPIR-V limits instructions to 65535
		// words, of which the first one is OpSourceContinued/length; the rest
		// will contain 65533 UTF8 characters (one word each) plus one last word
		// containing 3 ASCII characters and \0.
		{"long", opsource + "OpSourceContinued \"" + makeLongUTF8String(65533) + "ccc\""}
	};

	getDefaultColors(defaultColors);
	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameCodePair); ++testNdx)
	{
		fragments["debug"] = tests[testNdx].code;
		createTestsForAllStages(tests[testNdx].name, defaultColors, defaultColors, fragments, opSourceTests.get());
	}

	return opSourceTests.release();
}